

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

long duckdb::ListCosineDistanceFun::GetFunctions(void)

{
  NotImplementedException *this;
  long in_RDI;
  pointer pLVar1;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_259;
  long local_258;
  code *local_250 [2];
  code *local_240;
  code *local_238;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_230;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_228;
  undefined1 local_210 [48];
  LogicalType *local_1e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1d8;
  string local_1c0 [32];
  LogicalType local_1a0 [24];
  LogicalType local_188 [24];
  LogicalType list;
  ScalarFunction local_158;
  
  std::__cxx11::string::string(local_1c0,"list_cosine_distance",(allocator *)&local_158);
  local_258 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_1c0);
  duckdb::LogicalType::Real();
  local_1e0 = local_1d8.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_230 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
              (local_258 + 0x20);
  pLVar1 = local_1d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pLVar1 == local_1e0) {
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1d8);
      return local_258;
    }
    duckdb::LogicalType::LIST(&list);
    if (*pLVar1 == (LogicalType)0x17) {
      duckdb::LogicalType::LogicalType((LogicalType *)local_210,&list);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_210 + 0x18),&list);
      __l_00._M_len = 2;
      __l_00._M_array = (LogicalType *)local_210;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_228,__l_00,&local_259);
      duckdb::LogicalType::LogicalType(local_188,pLVar1);
      local_250[1] = (code *)0x0;
      local_250[0] = ListGenericFold<double,duckdb::CosineDistanceOp>;
      local_238 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_240 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_1a0,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_158,&local_228,local_188,local_250,0,0,0,0,local_1a0,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>(local_230,&local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      duckdb::LogicalType::~LogicalType(local_1a0);
      std::_Function_base::~_Function_base((_Function_base *)local_250);
      duckdb::LogicalType::~LogicalType(local_188);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_228);
      lVar2 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_210 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    else {
      if (*pLVar1 != (LogicalType)0x16) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_158,"List function not implemented for type %s",
                   (allocator *)local_250);
        duckdb::LogicalType::ToString_abi_cxx11_();
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,(string *)&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
        __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)local_210,&list);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_210 + 0x18),&list);
      __l._M_len = 2;
      __l._M_array = (LogicalType *)local_210;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_228,__l,&local_259);
      duckdb::LogicalType::LogicalType(local_188,pLVar1);
      local_250[1] = (code *)0x0;
      local_250[0] = ListGenericFold<float,duckdb::CosineDistanceOp>;
      local_238 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_240 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_1a0,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_158,&local_228,local_188,local_250,0,0,0,0,local_1a0,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>(local_230,&local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      duckdb::LogicalType::~LogicalType(local_1a0);
      std::_Function_base::~_Function_base((_Function_base *)local_250);
      duckdb::LogicalType::~LogicalType(local_188);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_228);
      lVar2 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_210 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    duckdb::LogicalType::~LogicalType(&list);
    pLVar1 = pLVar1 + 0x18;
  } while( true );
}

Assistant:

ScalarFunctionSet ListCosineDistanceFun::GetFunctions() {
	ScalarFunctionSet set("list_cosine_distance");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<CosineDistanceOp>(set, type);
	}
	return set;
}